

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O3

int spki_table_remove_entry(spki_table *spki_table,spki_record *spki_record)

{
  hash_cmp_fp p_Var1;
  tommy_list ptVar2;
  spki_update_fp p_Var3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *ptr;
  long lVar8;
  tommy_node_struct *ptVar9;
  uint8_t *puVar10;
  undefined8 *puVar11;
  tommy_list ptVar12;
  tommy_hashlin_node *ptVar13;
  long in_FS_OFFSET;
  byte bVar14;
  key_entry entry;
  spki_record in_stack_fffffffffffffe78;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_e8;
  uint32_t local_e4;
  undefined8 local_e0 [11];
  undefined2 local_88;
  uint8_t local_86;
  rtr_socket *local_80;
  long local_38;
  
  bVar14 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e4 = spki_record->asn;
  local_80 = spki_record->socket;
  local_e8 = *(undefined4 *)(spki_record->ski + 0x10);
  local_f8 = *(undefined8 *)spki_record->ski;
  uStack_f0 = *(undefined8 *)(spki_record->ski + 8);
  puVar10 = spki_record->spki;
  puVar11 = local_e0;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar11 = *(undefined8 *)puVar10;
    puVar10 = puVar10 + 8;
    puVar11 = puVar11 + 1;
  }
  local_88 = *(undefined2 *)(spki_record->spki + 0x58);
  local_86 = spki_record->spki[0x5a];
  uVar5 = local_e4 * -0x3f >> 0x11 ^ local_e4 * -0x3f;
  uVar5 = uVar5 * -0x1ff ^ uVar5 * -0x1ff0;
  uVar5 = uVar5 * -7 ^ uVar5 * -0x1c00;
  uVar5 = uVar5 >> 0xf ^ uVar5;
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  uVar6 = (spki_table->hashtable).low_mask & uVar5;
  if (uVar6 < (spki_table->hashtable).split) {
    uVar6 = (spki_table->hashtable).bucket_mask & uVar5;
  }
  uVar4 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  ptVar13 = (spki_table->hashtable).bucket[uVar4][uVar6];
  iVar7 = -3;
  if (ptVar13 != (tommy_hashlin_node *)0x0) {
    p_Var1 = spki_table->cmp_fp;
    do {
      if (ptVar13->key == uVar5) {
        iVar7 = (*p_Var1)(&local_f8,ptVar13->data);
        if (iVar7 == 0) {
          iVar7 = -3;
          if (ptVar13->data != (void *)0x0) {
            ptr = tommy_hashlin_remove(&spki_table->hashtable,spki_table->cmp_fp,&local_f8,uVar5);
            iVar7 = -1;
            if (ptr != (void *)0x0) {
              ptVar2 = *(tommy_list *)((long)ptr + 0xa0);
              ptVar12 = ptVar2;
              if (ptVar2 == (tommy_list)0x0) {
                ptVar12 = spki_table->list;
              }
              ptVar9 = (tommy_node_struct *)&spki_table->list;
              if (spki_table->list != (tommy_list)((long)ptr + 0xa0)) {
                ptVar9 = *(tommy_node_struct **)((long)ptr + 0xa8);
              }
              ptVar12->prev = *(tommy_node_struct **)((long)ptr + 0xa8);
              ptVar9->next = ptVar2;
              if (*(long *)((long)ptr + 0xb0) != 0) {
                lrtr_free(ptr);
                p_Var3 = spki_table->update_fp;
                if (p_Var3 == (spki_update_fp)0x0) {
                  iVar7 = 0;
                }
                else {
                  puVar11 = (undefined8 *)&stack0xfffffffffffffe78;
                  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
                    *puVar11 = *(undefined8 *)spki_record->ski;
                    spki_record = (spki_record *)((long)spki_record + (ulong)bVar14 * -0x10 + 8);
                    puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
                  }
                  iVar7 = 0;
                  (*p_Var3)(spki_table,in_stack_fffffffffffffe78,false);
                }
              }
            }
          }
          goto LAB_0010c35b;
        }
      }
      ptVar13 = ptVar13->next;
    } while (ptVar13 != (tommy_node_struct *)0x0);
    iVar7 = -3;
  }
LAB_0010c35b:
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_remove_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry entry;
	struct key_entry *rmv_elem;
	int rtval = SPKI_ERROR;

	spki_record_to_key_entry(spki_record, &entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);

	if (!tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash)) {
		rtval = SPKI_RECORD_NOT_FOUND;
	} else {
		/* Remove from hashtable and list */
		rmv_elem = tommy_hashlin_remove(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash);
		if (rmv_elem && tommy_list_remove_existing(&spki_table->list, &rmv_elem->list_node)) {
			lrtr_free(rmv_elem);
			spki_table_notify_clients(spki_table, spki_record, false);
			rtval = SPKI_SUCCESS;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return rtval;
}